

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall Func::EndProfiler(Func *this,Phase tag)

{
  ScriptContextProfiler *pSVar1;
  code *pcVar2;
  bool bVar3;
  Phase PVar4;
  undefined4 *puVar5;
  Func *pFVar6;
  
  pFVar6 = this->topFunc;
  if ((pFVar6->currentPhases).list.
      super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.count < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x502,"(this->GetTopFunc()->currentPhases.Count() > 0)",
                       "this->GetTopFunc()->currentPhases.Count() > 0");
    if (!bVar3) goto LAB_004286e7;
    *puVar5 = 0;
    pFVar6 = this->topFunc;
  }
  PVar4 = JsUtil::Stack<Js::Phase,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                    (&pFVar6->currentPhases);
  if (PVar4 != tag) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x504,"(tag == popped)","tag == popped");
    if (!bVar3) goto LAB_004286e7;
    *puVar5 = 0;
  }
  pSVar1 = this->m_codeGenProfiler;
  bVar3 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ProfileFlag);
  if (bVar3 == (pSVar1 == (ScriptContextProfiler *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x509,
                       "((this->m_codeGenProfiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))"
                       ,"Profiler tag is supplied but the profiler pointer is NULL");
    if (!bVar3) {
LAB_004286e7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (this->m_codeGenProfiler != (ScriptContextProfiler *)0x0) {
    Js::ScriptContextProfiler::ProfileEnd(this->m_codeGenProfiler,tag);
    return;
  }
  return;
}

Assistant:

void
Func::EndProfiler(Js::Phase tag)
{
#ifdef DBG
    Assert(this->GetTopFunc()->currentPhases.Count() > 0);
    Js::Phase popped = this->GetTopFunc()->currentPhases.Pop();
    Assert(tag == popped);
#endif

#ifdef PROFILE_EXEC
    AssertMsg((this->m_codeGenProfiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag),
        "Profiler tag is supplied but the profiler pointer is NULL");
    if (this->m_codeGenProfiler)
    {
        this->m_codeGenProfiler->ProfileEnd(tag);
    }
#endif
}